

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O1

void __thiscall MemorySSADumper::dumpSubgraphLabel(MemorySSADumper *this,RWSubgraph *subgraph)

{
  SubgraphInfo *pSVar1;
  
  pSVar1 = dg::dda::MemorySSATransformation::getSubgraphInfo
                     (*(MemorySSATransformation **)
                       (((this->super_Dumper).DDA)->DDA)._M_t.
                       super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                       .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>._M_head_impl
                      ,subgraph);
  if (pSVar1 != (SubgraphInfo *)0x0) {
    printf("  label=<<table cellborder=\"0\"><tr><td colspan=\"4\">subgraph %s (%p)</td></tr>\n<tr><td colspan=\"4\">-- summary -- </td></tr>\n"
           ,*(undefined8 *)(subgraph + 0x30),subgraph);
    printf("<tr><td colspan=\"4\">==  inputs ==</td></tr>");
    dumpDDIMap(this,(DefinitionsMap<dg::dda::RWNode> *)(pSVar1 + 0x38));
    printf("<tr><td colspan=\"4\">==  outputs ==</td></tr>");
    dumpDDIMap(this,(DefinitionsMap<dg::dda::RWNode> *)(pSVar1 + 0x70));
    puts("</table>>;");
    return;
  }
  printf("  label=<<table cellborder=\"0\">\n<tr><td>subgraph %s(%p)</td></tr>\n<tr><td>no summary</td></tr></table>>;\n"
         ,*(undefined8 *)(subgraph + 0x30),subgraph);
  return;
}

Assistant:

void dumpSubgraphLabel(RWSubgraph *subgraph) override {
        auto *SSA = static_cast<MemorySSATransformation *>(
                DDA->getDDA()->getImpl());
        const auto *summary = SSA->getSummary(subgraph);

        if (!summary) {
            printf("  label=<<table cellborder=\"0\">\n"
                   "<tr><td>subgraph %s(%p)</td></tr>\n"
                   "<tr><td>no summary</td></tr></table>>;\n",
                   subgraph->getName().c_str(), subgraph);
            return;
        }

        printf("  label=<<table cellborder=\"0\"><tr><td "
               "colspan=\"4\">subgraph %s (%p)</td></tr>\n"
               "<tr><td colspan=\"4\">-- summary -- </td></tr>\n",
               subgraph->getName().c_str(), subgraph);
        printf("<tr><td colspan=\"4\">==  inputs ==</td></tr>");
        dumpDDIMap(summary->inputs);
        printf("<tr><td colspan=\"4\">==  outputs ==</td></tr>");
        dumpDDIMap(summary->outputs);
        printf("</table>>;\n");
    }